

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLimitReadFile.cpp
# Opt level: O0

void __thiscall
irr::io::CLimitReadFile::CLimitReadFile
          (CLimitReadFile *this,IReadFile *alreadyOpenedFile,long pos,long areaSize,path *name)

{
  long in_RCX;
  undefined8 in_RDX;
  _func_int **in_RSI;
  IReadFile *in_RDI;
  string<char> *in_stack_ffffffffffffffc8;
  
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)&in_RDI[2].field_0x8);
  IReadFile::IReadFile(in_RDI,&PTR_construction_vtable_24__00441c18);
  in_RDI->_vptr_IReadFile = (_func_int **)0x441ba8;
  *(undefined8 *)&in_RDI[2].field_0x8 = 0x441c00;
  core::string<char>::string((string<char> *)in_RDI,in_stack_ffffffffffffffc8);
  *(undefined8 *)&in_RDI[1].field_0x8 = 0;
  *(undefined8 *)&in_RDI[1].field_0x10 = 0;
  *(undefined8 *)&in_RDI[1].field_0x18 = 0;
  in_RDI[2]._vptr_IReadFile = in_RSI;
  if (in_RDI[2]._vptr_IReadFile != (_func_int **)0x0) {
    IReferenceCounted::grab
              ((IReferenceCounted *)
               ((long)in_RDI[2]._vptr_IReadFile + *(long *)(*in_RDI[2]._vptr_IReadFile + -0x18)));
    *(undefined8 *)&in_RDI[1].field_0x8 = in_RDX;
    *(long *)&in_RDI[1].field_0x10 = *(long *)&in_RDI[1].field_0x8 + in_RCX;
  }
  return;
}

Assistant:

CLimitReadFile::CLimitReadFile(IReadFile *alreadyOpenedFile, long pos,
		long areaSize, const io::path &name) :
		Filename(name),
		AreaStart(0), AreaEnd(0), Pos(0),
		File(alreadyOpenedFile)
{
#ifdef _DEBUG
	setDebugName("CLimitReadFile");
#endif

	if (File) {
		File->grab();
		AreaStart = pos;
		AreaEnd = AreaStart + areaSize;
	}
}